

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetOwnPropertyNames2(JSContext *ctx,JSValue obj1,int flags,int kind)

{
  JSAtom prop;
  JSShape *pJVar1;
  JSValue JVar2;
  int iVar3;
  JSValueUnion p_00;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSRefCountHeader *p;
  int64_t iVar6;
  ulong uVar7;
  JSRefCountHeader *p_1;
  ulong uVar8;
  ulong uVar9;
  JSValue this_obj;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue prop_00;
  uint32_t len;
  JSPropertyEnum *atoms;
  JSPropertyDescriptor desc;
  uint local_b0;
  uint local_a4;
  uint local_9c;
  JSValueUnion local_98;
  uint local_8c;
  JSPropertyEnum *local_88;
  ulong local_80;
  ulong local_78;
  JSPropertyEnum *local_70;
  JSValue local_68;
  
  JVar10 = JS_ToObject(ctx,obj1);
  p_00 = JVar10.u;
  if ((uint)JVar10.tag == 6) {
    uVar8 = 6;
    uVar9 = 0;
    uVar7 = 0;
    goto LAB_00142abe;
  }
  iVar3 = JS_GetOwnPropertyNamesInternal
                    (ctx,&local_88,&local_9c,(JSObject *)p_00.ptr,flags & 0xffffffef);
  if (iVar3 == 0) {
    pJVar1 = ctx->array_shape;
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
    local_8c = flags;
    JVar11 = JS_NewObjectFromShape(ctx,pJVar1,2);
    this_obj.tag = JVar11.tag;
    local_98 = JVar11.u;
    if ((int)JVar11.tag == 6) {
LAB_001427d5:
      local_98 = JVar11.u;
      local_b0 = (uint)JVar11.tag;
      if (0xfffffff4 < local_b0) {
        iVar3 = *local_98.ptr;
        *(int *)local_98.ptr = iVar3 + -1;
        if (iVar3 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar11);
        }
        goto LAB_0014279e;
      }
      uVar7 = 0;
      JVar12 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00142a82:
      local_98 = JVar11.u;
    }
    else {
      uVar7 = (ulong)local_98.ptr & 0xffffffff00000000;
      local_78 = (ulong)local_9c;
      JVar12 = JVar11;
      if (local_78 == 0) goto LAB_00142a82;
      local_70 = local_88;
      uVar9 = 0;
      local_a4 = 0;
      local_80 = uVar7;
      do {
        uVar8 = (ulong)(uint)kind;
        prop = local_70[uVar9].atom;
        if ((local_8c & 0x10) == 0) {
LAB_0014286c:
          if (kind == 1) {
            JVar12 = JS_GetPropertyInternal(ctx,JVar10,prop,JVar10,0);
LAB_001429c1:
            JVar11.tag = this_obj.tag;
            JVar11.u.ptr = local_98.ptr;
            if ((int)JVar12.tag == 6) goto LAB_001427d5;
          }
          else {
            if (kind != 2) {
              JVar12 = __JS_AtomToValue(ctx,prop,0);
              goto LAB_001429c1;
            }
            pJVar1 = ctx->array_shape;
            (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
            JVar12 = JS_NewObjectFromShape(ctx,pJVar1,2);
            JVar11.tag = this_obj.tag;
            JVar11.u.ptr = local_98.ptr;
            if ((uint)JVar12.tag == 6) goto LAB_001427d5;
            JVar11 = __JS_AtomToValue(ctx,prop,0);
            if (((((int)JVar11.tag == 6) ||
                 (local_68 = JVar11,
                 iVar3 = JS_DefinePropertyValueValue(ctx,JVar12,(JSValue)ZEXT816(0),JVar11,0x4007),
                 iVar3 < 0)) ||
                (JVar11 = JS_GetPropertyInternal(ctx,JVar10,prop,JVar10,0), (int)JVar11.tag == 6))
               || (local_68 = JVar11,
                  iVar3 = JS_DefinePropertyValueValue(ctx,JVar12,(JSValue)ZEXT816(1),JVar11,0x4007),
                  iVar3 < 0)) {
              JVar2.tag = this_obj.tag;
              JVar2.u.ptr = local_98.ptr;
              JVar11.u.ptr = local_98.ptr;
              if ((0xfffffff4 < (uint)JVar12.tag) &&
                 (iVar3 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar3 + -1, JVar11 = JVar2,
                 iVar3 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar12);
                JVar11.u.ptr = local_98.ptr;
              }
              goto LAB_001427d5;
            }
          }
          JVar4._4_4_ = 0;
          JVar4.int32 = local_a4;
          JVar5.float64 = (double)JVar4.float64;
          if (-1 < (int)local_a4) {
            JVar5 = JVar4;
          }
          iVar6 = 7;
          if (-1 < (int)local_a4) {
            iVar6 = 0;
          }
          this_obj.u.ptr = local_98.ptr;
          prop_00.tag = iVar6;
          prop_00.u.float64 = JVar5.float64;
          local_68 = JVar12;
          iVar3 = JS_DefinePropertyValueValue(ctx,this_obj,prop_00,JVar12,7);
          JVar11.tag = this_obj.tag;
          JVar11.u.ptr = local_98.ptr;
          if (iVar3 < 0) goto LAB_001427d5;
          local_a4 = local_a4 + 1;
        }
        else {
          iVar3 = JS_GetOwnPropertyInternal
                            (ctx,(JSPropertyDescriptor *)&local_68,(JSObject *)p_00.ptr,prop);
          if (iVar3 < 0) {
            iVar3 = 2;
          }
          else if (iVar3 == 0) {
            iVar3 = 5;
          }
          else {
            js_free_desc(ctx,(JSPropertyDescriptor *)&local_68);
            iVar3 = 5;
            if (((undefined1  [16])local_68 & (undefined1  [16])0x4) != (undefined1  [16])0x0)
            goto LAB_0014286c;
          }
          JVar11.tag = this_obj.tag;
          JVar11.u.ptr = local_98.ptr;
          if (iVar3 != 5) {
            if (iVar3 == 2) goto LAB_001427d5;
            uVar9 = 0;
            uVar7 = 0;
            goto LAB_00142abe;
          }
        }
        JVar12.tag = this_obj.tag;
        JVar12.u.ptr = local_98.ptr;
        uVar9 = uVar9 + 1;
        uVar7 = local_80;
      } while (local_78 != uVar9);
    }
  }
  else {
LAB_0014279e:
    JVar12 = (JSValue)(ZEXT816(6) << 0x40);
    uVar7 = 0;
  }
  uVar8 = JVar12.tag;
  js_free_prop_enum(ctx,local_88,local_9c);
  if ((0xfffffff4 < (uint)JVar10.tag) &&
     (iVar3 = *p_00.ptr, *(int *)p_00.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar10);
  }
  uVar9 = (ulong)JVar12.u.ptr & 0xffffffff;
LAB_00142abe:
  JVar10.u.ptr = (void *)(uVar9 | uVar7);
  JVar10.tag = uVar8;
  return JVar10;
}

Assistant:

static JSValue JS_GetOwnPropertyNames2(JSContext *ctx, JSValueConst obj1,
                                       int flags, int kind)
{
    JSValue obj, r, val, key, value;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i, j;

    r = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, obj1);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, flags & ~JS_GPN_ENUM_ONLY))
        goto exception;
    r = JS_NewArray(ctx);
    if (JS_IsException(r))
        goto exception;
    for(j = i = 0; i < len; i++) {
        JSAtom atom = atoms[i].atom;
        if (flags & JS_GPN_ENUM_ONLY) {
            JSPropertyDescriptor desc;
            int res;

            /* Check if property is still enumerable */
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
            if (res < 0)
                goto exception;
            if (!res)
                continue;
            js_free_desc(ctx, &desc);
            if (!(desc.flags & JS_PROP_ENUMERABLE))
                continue;
        }
        switch(kind) {
        default:
        case JS_ITERATOR_KIND_KEY:
            val = JS_AtomToValue(ctx, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_VALUE:
            val = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_KEY_AND_VALUE:
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto exception;
            key = JS_AtomToValue(ctx, atom);
            if (JS_IsException(key))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 0, key, JS_PROP_THROW) < 0)
                goto exception1;
            value = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(value))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 1, value, JS_PROP_THROW) < 0)
                goto exception1;
            break;
        }
        if (JS_CreateDataPropertyUint32(ctx, r, j++, val, 0) < 0)
            goto exception;
    }
    goto done;

exception1:
    JS_FreeValue(ctx, val);
exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
done:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, obj);
    return r;
}